

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

Vector<tcu::Vector<float,_2>,_3> *
deqp::gles3::Functional::calculateLodDerivateParts
          (Vector<tcu::Vector<float,_2>,_3> *__return_storage_ptr__,Mat4 *transformation)

{
  Vector<float,_4> local_98;
  Vec3 trans00;
  Vec3 trans10;
  Vec3 trans01;
  tcu local_40 [16];
  
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 1.0;
  local_98.m_data[3] = 1.0;
  tcu::operator*(local_40,transformation,&local_98);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&trans00);
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 1.0;
  local_98.m_data[2] = 1.0;
  local_98.m_data[3] = 1.0;
  tcu::operator*(local_40,transformation,&local_98);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&trans01);
  local_98.m_data[0] = 1.0;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 1.0;
  local_98.m_data[3] = 1.0;
  tcu::operator*(local_40,transformation,&local_98);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&trans10);
  __return_storage_ptr__->m_data[0].m_data[0] = trans10.m_data[0] - trans00.m_data[0];
  __return_storage_ptr__->m_data[0].m_data[1] = trans01.m_data[0] - trans00.m_data[0];
  __return_storage_ptr__->m_data[1].m_data[0] = trans10.m_data[1] - trans00.m_data[1];
  __return_storage_ptr__->m_data[1].m_data[1] = trans01.m_data[1] - trans00.m_data[1];
  *(ulong *)__return_storage_ptr__->m_data[2].m_data =
       CONCAT44(trans01.m_data[2] - trans00.m_data[2],trans10.m_data[2] - trans00.m_data[2]);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<tcu::Vec2, 3> calculateLodDerivateParts (const Mat4& transformation)
{
	// Calculate transformed coordinates of three screen corners.
	Vec3 trans00 = (transformation * Vec4(0.0f, 0.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans01 = (transformation * Vec4(0.0f, 1.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans10 = (transformation * Vec4(1.0f, 0.0f, 1.0f, 1.0f)).xyz();

	return tcu::Vector<tcu::Vec2, 3>(Vec2(trans10.x() - trans00.x(), trans01.x() - trans00.x()),
									 Vec2(trans10.y() - trans00.y(), trans01.y() - trans00.y()),
									 Vec2(trans10.z() - trans00.z(), trans01.z() - trans00.z()));
}